

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleDemo_common.hpp
# Opt level: O1

void cos1D_testSaveLoadAndParamHandling<IMLE<1,1,FastLinearExpert>>
               (IMLE<1,_1,_FastLinearExpert> *imleObj)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  pointer pFVar3;
  long lVar4;
  Scal *pSVar5;
  Scal *pSVar6;
  Scal *pSVar7;
  byte bVar8;
  Param param;
  string local_e8;
  undefined4 local_c8;
  undefined4 uStack_c4;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  double local_b8;
  Scal local_b0 [11];
  int local_58;
  bool local_54;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  bVar8 = 0;
  local_c8 = *(undefined4 *)&imleObj->param;
  uStack_c4 = *(undefined4 *)&(imleObj->param).field_0x4;
  uStack_c0 = *(undefined4 *)&(imleObj->param).alpha;
  uStack_bc = *(undefined4 *)((long)&(imleObj->param).alpha + 4);
  local_b8 = (imleObj->param).Psi0.super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.
             m_storage.m_data.array[0];
  pSVar7 = &(imleObj->param).sigma0;
  pSVar5 = pSVar7;
  pSVar6 = local_b0;
  for (lVar4 = 0xb; lVar4 != 0; lVar4 = lVar4 + -1) {
    *pSVar6 = *pSVar5;
    pSVar5 = pSVar5 + 1;
    pSVar6 = pSVar6 + 1;
  }
  local_54 = (imleObj->param).saveOnExit;
  local_58 = (imleObj->param).iterMax;
  local_50[0] = local_40;
  pcVar2 = (imleObj->param).defaultSave._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,pcVar2,pcVar2 + (imleObj->param).defaultSave._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\t-- Initial parameters: --",0x1a);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x18');
  std::ostream::put('\x18');
  std::ostream::flush();
  IMLE<1,_1,_FastLinearExpert>::Param::display(&imleObj->param,(ostream *)&std::cout);
  paVar1 = &local_e8.field_2;
  local_e8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"cos1D.xml","");
  IMLE<1,_1,_FastLinearExpert>::loadParameters(imleObj,&local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\t-- Now the IMLE object has default parameters: --",0x32);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x18');
  std::ostream::put('\x18');
  std::ostream::flush();
  IMLE<1,_1,_FastLinearExpert>::Param::display(&imleObj->param,(ostream *)&std::cout);
  *(ulong *)&imleObj->param = CONCAT44(uStack_c4,local_c8);
  (imleObj->param).alpha = (Scal)CONCAT44(uStack_bc,uStack_c0);
  (imleObj->param).Psi0.super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.
  m_data.array[0] = local_b8;
  pSVar5 = local_b0;
  for (lVar4 = 0xb; lVar4 != 0; lVar4 = lVar4 + -1) {
    *pSVar7 = *pSVar5;
    pSVar5 = pSVar5 + (ulong)bVar8 * -2 + 1;
    pSVar7 = pSVar7 + (ulong)bVar8 * -2 + 1;
  }
  (imleObj->param).saveOnExit = local_54;
  (imleObj->param).iterMax = local_58;
  std::__cxx11::string::_M_assign((string *)&(imleObj->param).defaultSave);
  IMLE<1,_1,_FastLinearExpert>::set_internal_parameters(imleObj);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\t-- Reverting to initial parameters: --",0x27);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x18');
  std::ostream::put('\x18');
  std::ostream::flush();
  IMLE<1,_1,_FastLinearExpert>::Param::display(&imleObj->param,(ostream *)&std::cout);
  cos1D_train<IMLE<1,1,FastLinearExpert>>(imleObj,10);
  cos1D_display<IMLE<1,1,FastLinearExpert>>(imleObj);
  local_e8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"cos1D_demo.imle","");
  IMLE<1,_1,_FastLinearExpert>::save(imleObj,&local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
  pFVar3 = (imleObj->experts).
           super_vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
           .
           super__Vector_base<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((imleObj->experts).
      super_vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
      .
      super__Vector_base<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pFVar3) {
    (imleObj->experts).
    super_vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
    .
    super__Vector_base<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pFVar3;
  }
  IMLE<1,_1,_FastLinearExpert>::set_internal_parameters(imleObj);
  imleObj->noise_to_go = 0;
  operator<<((ostream *)&std::cout,imleObj);
  cos1D_train<IMLE<1,1,FastLinearExpert>>(imleObj,0x14);
  cos1D_display<IMLE<1,1,FastLinearExpert>>(imleObj);
  local_e8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"cos1D_demo.imle","");
  IMLE<1,_1,_FastLinearExpert>::load(imleObj,&local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
  operator<<((ostream *)&std::cout,imleObj);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  return;
}

Assistant:

void cos1D_testSaveLoadAndParamHandling( Learner &imleObj )
{
	// Parameter handling
	typename Learner::Param param = imleObj.getParameters();
	cout << "\t-- Initial parameters: --" << endl;
	imleObj.displayParameters();

	imleObj.loadParameters("cos1D.xml");
	cout << "\t-- Now the IMLE object has default parameters: --" << endl;
	imleObj.displayParameters();

	imleObj.setParameters(param);
	cout << "\t-- Reverting to initial parameters: --" << endl;
	imleObj.displayParameters();

	// Training (10 points)
    cos1D_train(imleObj, 10);

    // Display info
    cos1D_display(imleObj);

    // Save
    imleObj.save("cos1D_demo.imle");

    // Reset
    imleObj.reset();
    cout << imleObj;

    // Train again
    cos1D_train(imleObj, 20);
    cos1D_display(imleObj);

    // Load
    imleObj.load("cos1D_demo.imle");
    cout << imleObj;
}